

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O1

void __thiscall QLocalSocketPrivate::QLocalSocketPrivate(QLocalSocketPrivate *this)

{
  QIODevicePrivate::QIODevicePrivate(&this->super_QIODevicePrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QLocalSocketPrivate_002d5990;
  QTcpSocket::QTcpSocket(&(this->unixSocket).super_QTcpSocket,(QObject *)0x0);
  *(undefined ***)&(this->unixSocket).super_QTcpSocket.super_QAbstractSocket =
       &PTR_metaObject_002d59f0;
  this->delayConnect = (QSocketNotifier *)0x0;
  this->connectTimer = (QTimer *)0x0;
  (this->connectingName).d.d = (Data *)0x0;
  (this->connectingName).d.ptr = (char16_t *)0x0;
  (this->connectingName).d.size = 0;
  this->connectingSocket = -1;
  this->connectingOpenMode = (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)0x0;
  this->state = UnconnectedState;
  (this->serverName).d.d = (Data *)0x0;
  (this->serverName).d.ptr = (char16_t *)0x0;
  (this->serverName).d.size = 0;
  (this->fullServerName).d.d = (Data *)0x0;
  (this->fullServerName).d.ptr = (char16_t *)0x0;
  (this->fullServerName).d.size = 0;
  (this->socketOptions).super_QPropertyData<QFlags<QLocalSocket::SocketOption>_>.val.
  super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>.
  super_QFlagsStorage<QLocalSocket::SocketOption>.i = 0;
  return;
}

Assistant:

QLocalSocketPrivate::QLocalSocketPrivate() : QIODevicePrivate(),
        delayConnect(nullptr),
        connectTimer(nullptr),
        connectingSocket(-1),
        state(QLocalSocket::UnconnectedState),
        socketOptions(QLocalSocket::NoOptions)
{
}